

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1247fe5::TransitiveLinkImpl::Follow
          (TransitiveLinkImpl *this,cmGeneratorTarget *target)

{
  PolicyStatus PVar1;
  cmLinkInterfaceLibraries *this_00;
  reference pcVar2;
  bool bVar3;
  pair<std::__detail::_Node_iterator<const_cmGeneratorTarget_*,_true,_false>,_bool> pVar4;
  pair<std::_Rb_tree_const_iterator<cmLinkItem>,_bool> pVar5;
  cmLinkItem *item_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range1_2;
  cmLinkItem *item_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range1_1;
  _Base_ptr local_80;
  undefined1 local_78;
  _Base_ptr local_70;
  undefined1 local_68;
  value_type *local_60;
  cmLinkItem *item;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range1;
  cmLinkInterfaceLibraries *iface;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *target_local;
  TransitiveLinkImpl *this_local;
  
  bVar3 = true;
  local_18 = target;
  target_local = (cmGeneratorTarget *)this;
  if (target != (cmGeneratorTarget *)0x0) {
    pVar4 = std::
            unordered_set<const_cmGeneratorTarget_*,_std::hash<const_cmGeneratorTarget_*>,_std::equal_to<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::insert(&this->Followed,&local_18);
    bVar3 = true;
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      PVar1 = cmGeneratorTarget::GetPolicyStatusCMP0022(local_18);
      bVar3 = true;
      if (PVar1 != OLD) {
        PVar1 = cmGeneratorTarget::GetPolicyStatusCMP0022(local_18);
        bVar3 = PVar1 == WARN;
      }
    }
  }
  if ((!bVar3) &&
     (this_00 = cmGeneratorTarget::GetLinkInterfaceLibraries
                          (local_18,this->Config,this->Self,this->ImplFor),
     this_00 != (cmLinkInterfaceLibraries *)0x0)) {
    if ((this_00->HadContextSensitiveCondition & 1U) != 0) {
      (this->Impl->super_cmLinkImplementationLibraries).HadContextSensitiveCondition = true;
    }
    __end1 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(&this_00->HeadInclude);
    item = (cmLinkItem *)
           std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(&this_00->HeadInclude);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                       *)&item), bVar3) {
      local_60 = __gnu_cxx::
                 __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                 ::operator*(&__end1);
      Follow(this,local_60->Target);
      pVar5 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                        (&this->Emitted,local_60);
      local_80 = (_Base_ptr)pVar5.first._M_node;
      local_78 = pVar5.second;
      local_70 = local_80;
      local_68 = local_78;
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        __range1_1._7_1_ = 0;
        std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>::
        emplace_back<cmLinkItem_const&,bool>
                  ((vector<cmLinkImplItem,std::allocator<cmLinkImplItem>> *)this->Impl,local_60,
                   (bool *)((long)&__range1_1 + 7));
      }
      __gnu_cxx::
      __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
      operator++(&__end1);
    }
    __end1_1 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(&this_00->Libraries);
    item_1 = (cmLinkItem *)
             std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(&this_00->Libraries);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                               *)&item_1), bVar3) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
               ::operator*(&__end1_1);
      Follow(this,pcVar2->Target);
      __gnu_cxx::
      __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
      operator++(&__end1_1);
    }
    __end1_2 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(&this_00->HeadExclude);
    item_2 = (cmLinkItem *)
             std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(&this_00->HeadExclude);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                               *)&item_2), bVar3) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
               ::operator*(&__end1_2);
      std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                (&this->Excluded,pcVar2);
      __gnu_cxx::
      __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
      operator++(&__end1_2);
    }
  }
  return;
}

Assistant:

void TransitiveLinkImpl::Follow(cmGeneratorTarget const* target)
{
  if (!target || !this->Followed.insert(target).second ||
      target->GetPolicyStatusCMP0022() == cmPolicies::OLD ||
      target->GetPolicyStatusCMP0022() == cmPolicies::WARN) {
    return;
  }

  // Get this target's usage requirements.
  cmLinkInterfaceLibraries const* iface =
    target->GetLinkInterfaceLibraries(this->Config, this->Self, this->ImplFor);
  if (!iface) {
    return;
  }
  if (iface->HadContextSensitiveCondition) {
    this->Impl.HadContextSensitiveCondition = true;
  }

  // Process 'INTERFACE_LINK_LIBRARIES_DIRECT' usage requirements.
  for (cmLinkItem const& item : iface->HeadInclude) {
    // Inject direct dependencies from the item's usage requirements
    // before the item itself.
    this->Follow(item.Target);

    // Add the item itself, but at most once.
    if (this->Emitted.insert(item).second) {
      this->Impl.Libraries.emplace_back(item, /* checkCMP0027= */ false);
    }
  }

  // Follow transitive dependencies.
  for (cmLinkItem const& item : iface->Libraries) {
    this->Follow(item.Target);
  }

  // Record exclusions from 'INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE'
  // usage requirements.
  for (cmLinkItem const& item : iface->HeadExclude) {
    this->Excluded.insert(item);
  }
}